

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

Instruction * __thiscall spvtools::opt::Instruction::GetBaseAddress(Instruction *this)

{
  undefined1 uVar1;
  IRContext *this_00;
  uint32_t uVar2;
  Instruction *this_01;
  uint uVar3;
  
  uVar2 = (this->has_result_id_ & 1) + 1;
  if (this->has_type_id_ == false) {
    uVar2 = (uint)this->has_result_id_;
  }
  uVar2 = GetSingleWordOperand(this,uVar2);
  this_00 = this->context_;
  uVar1 = (undefined1)this_00->valid_analyses_;
  while( true ) {
    if ((uVar1 & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = analysis::DefUseManager::GetDef
                        ((this_00->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,uVar2);
    uVar3 = this_01->opcode_ - OpImageTexelPointer;
    if ((0x17 < uVar3) || ((0x8004e1U >> (uVar3 & 0x1f) & 1) == 0)) break;
    uVar2 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar2 = (uint)this_01->has_result_id_;
    }
    uVar2 = GetSingleWordOperand(this_01,uVar2);
    this_00 = this->context_;
    uVar1 = (undefined1)this_00->valid_analyses_;
  }
  return this_01;
}

Assistant:

Instruction* Instruction::GetBaseAddress() const {
  uint32_t base = GetSingleWordInOperand(kLoadBaseIndex);
  Instruction* base_inst = context()->get_def_use_mgr()->GetDef(base);
  bool done = false;
  while (!done) {
    switch (base_inst->opcode()) {
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
      case spv::Op::OpPtrAccessChain:
      case spv::Op::OpInBoundsPtrAccessChain:
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpCopyObject:
        // All of these instructions have the base pointer use a base pointer
        // in in-operand 0.
        base = base_inst->GetSingleWordInOperand(0);
        base_inst = context()->get_def_use_mgr()->GetDef(base);
        break;
      default:
        done = true;
        break;
    }
  }
  return base_inst;
}